

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library.cpp
# Opt level: O0

PyObject * PyInit_example(void)

{
  int iVar1;
  PyObject *pPVar2;
  
  if (PyInit_example::moduledef == '\0') {
    iVar1 = __cxa_guard_acquire(&PyInit_example::moduledef);
    if (iVar1 != 0) {
      memcpy(&PyInit_example::moduledef,&PyInit_example::initial_m_base,0x28);
      PyInit_example::moduledef.m_name = "example";
      PyInit_example::moduledef.m_doc = (char *)0x0;
      PyInit_example::moduledef.m_size = -1;
      PyInit_example::moduledef.m_methods = PyInit_example::initial_methods;
      PyInit_example::moduledef.m_slots = (PyModuleDef_Slot *)0x0;
      PyInit_example::moduledef.m_traverse = (traverseproc)0x0;
      PyInit_example::moduledef.m_clear = (inquiry)0x0;
      PyInit_example::moduledef.m_free = (freefunc)0x0;
      __cxa_guard_release(&PyInit_example::moduledef);
    }
  }
  pPVar2 = (PyObject *)
           boost::python::detail::init_module(&PyInit_example::moduledef,init_module_example);
  return pPVar2;
}

Assistant:

BOOST_PYTHON_MODULE(example)
{
  namespace python = boost::python;
  python::class_<ExampleClass>("ExampleClass")
    .def("print", &ExampleClass::print_state)
    .def("exporter", &example_class_export_wrap)
    .def("set_data", &ExampleClass::set_data)
    .def("importer", &example_class_import_wrap)
    ;
}